

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_load.cpp
# Opt level: O1

duckdb_database * duckdb::ExtensionAccess::GetDatabase(duckdb_extension_info info)

{
  duckdb_extension_info this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  DuckDB *pDVar1;
  pointer __p;
  pointer pDVar2;
  DuckDB *__tmp;
  undefined1 local_d1;
  DuckDB *local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8 [21];
  
  __p = (pointer)operator_new(0x10);
  (__p->database).internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->database).internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = info + 0x10;
  ::std::__uniq_ptr_impl<duckdb::DatabaseWrapper,_std::default_delete<duckdb::DatabaseWrapper>_>::
  reset((__uniq_ptr_impl<duckdb::DatabaseWrapper,_std::default_delete<duckdb::DatabaseWrapper>_> *)
        this,__p);
  local_d0 = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::DuckDB,std::allocator<duckdb::DuckDB>,duckdb::DatabaseInstance&>
            (local_c8,&local_d0,(allocator<duckdb::DuckDB> *)&local_d1,*(DatabaseInstance **)info);
  pDVar1 = local_d0;
  if (local_c8[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c8[0]._M_pi)->_M_use_count = (local_c8[0]._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_c8[0]._M_pi)->_M_use_count = (local_c8[0]._M_pi)->_M_use_count + 1;
    }
  }
  if (local_c8[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8[0]._M_pi);
  }
  pDVar2 = unique_ptr<duckdb::DatabaseWrapper,_std::default_delete<duckdb::DatabaseWrapper>,_true>::
           operator->((unique_ptr<duckdb::DatabaseWrapper,_std::default_delete<duckdb::DatabaseWrapper>,_true>
                       *)this);
  (pDVar2->database).internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = pDVar1;
  this_00 = (pDVar2->database).internal.
            super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pDVar2->database).internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_c8[0]._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return (duckdb_database *)
         (_Tuple_impl<0UL,_duckdb::DatabaseWrapper_*,_std::default_delete<duckdb::DatabaseWrapper>_>
         )*(tuple<duckdb::DatabaseWrapper_*,_std::default_delete<duckdb::DatabaseWrapper>_> *)this;
}

Assistant:

static duckdb_database *GetDatabase(duckdb_extension_info info) {
		auto &load_state = DuckDBExtensionLoadState::Get(info);

		try {
			// Create the duckdb_database
			load_state.database_data = make_uniq<DatabaseWrapper>();
			load_state.database_data->database = make_shared_ptr<DuckDB>(load_state.db);
			return reinterpret_cast<duckdb_database *>(load_state.database_data.get());
		} catch (std::exception &ex) {
			load_state.has_error = true;
			load_state.error_data = ErrorData(ex);
			return nullptr;
		} catch (...) {
			load_state.has_error = true;
			load_state.error_data =
			    ErrorData(ExceptionType::UNKNOWN_TYPE, "Unknown error in GetDatabase when trying to load extension!");
			return nullptr;
		}
	}